

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void pbrt::ErrorExit<char_const(&)[15]>(FileLoc *loc,char *fmt,char (*args) [15])

{
  char (*in_RCX) [15];
  string local_30;
  
  StringPrintf<char_const(&)[15]>(&local_30,(pbrt *)fmt,*args,in_RCX);
  ErrorExit(loc,local_30._M_dataplus._M_p);
}

Assistant:

[[noreturn]] inline void ErrorExit(const FileLoc *loc, const char *fmt, Args &&... args) {
    ErrorExit(loc, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}